

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_br89.c
# Opt level: O0

double xc_mgga_x_br89_get_x(double Q)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double x2;
  double x1;
  double tol;
  double rhs;
  double in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  xc_brent_f *in_stack_00000048;
  double local_8;
  
  if (5e-12 <= ABS((double)CONCAT44(in_XMM0_Db,in_XMM0_Da))) {
    pow(3.141592653589793,0.6666666666666666);
    local_8 = xc_math_brent(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
                            Q,(void *)rhs);
  }
  else {
    local_8 = 2.0;
  }
  return local_8;
}

Assistant:

GPU_FUNCTION
double xc_mgga_x_br89_get_x(double Q)
{
  double rhs, tol, x1, x2;

  tol = 5e-12;
  if(fabs(Q) < 5e-12)
    return 2.0;

  /* build right-hand side of the non-linear equation
     Remember we use a different definition of tau */
  rhs = 2.0/3.0*pow(M_PI, 2.0/3.0)/Q;

  /* starting interval */
  if(rhs > 0.0) {
    x1 = 2.0;
    x2 = 1.0/rhs + 2.0;
  }else{
    x2 = 2.0;
    x1 = 0.0;
  }

  return xc_math_brent(br89_x_Q, x1, x2, tol, 500, &rhs);
}